

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O1

void dsfmt_gen_rand_all(dsfmt_t *dsfmt)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = *(ulong *)((long)dsfmt->status + 0xbf8);
  uVar3 = (uVar1 << 0x20 | uVar1 >> 0x20) ^ dsfmt->status[0].u[0] << 0x13 ^ dsfmt->status[0x75].u[0]
  ;
  uVar1 = dsfmt->status[0].u[1];
  uVar2 = (dsfmt->status[0xbf].u[0] << 0x20 | dsfmt->status[0xbf].u[0] >> 0x20) ^ uVar1 << 0x13 ^
          *(ulong *)((long)dsfmt->status + 0x758);
  dsfmt->status[0].u[0] = uVar3 & 0xffafffffffb3f ^ uVar3 >> 0xc ^ dsfmt->status[0].u[0];
  dsfmt->status[0].u[1] = uVar2 & 0xffdfffc90fffd ^ uVar2 >> 0xc ^ uVar1;
  lVar6 = 0;
  do {
    uVar1 = *(ulong *)((long)dsfmt->status + lVar6 + 0x10);
    uVar5 = *(ulong *)((long)dsfmt->status + lVar6 + 0x18);
    uVar4 = (uVar2 << 0x20 | uVar2 >> 0x20) ^ uVar1 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar6 + 0x760);
    uVar2 = (uVar3 << 0x20 | uVar3 >> 0x20) ^ uVar5 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar6 + 0x768);
    *(ulong *)((long)dsfmt->status + lVar6 + 0x10) = uVar4 & 0xffafffffffb3f ^ uVar4 >> 0xc ^ uVar1;
    *(ulong *)((long)dsfmt->status + lVar6 + 0x18) = uVar2 & 0xffdfffc90fffd ^ uVar2 >> 0xc ^ uVar5;
    lVar6 = lVar6 + 0x10;
    uVar3 = uVar4;
  } while (lVar6 != 0x490);
  lVar6 = 0;
  do {
    uVar1 = *(ulong *)((long)dsfmt->status + lVar6 + 0x4a0);
    uVar3 = *(ulong *)((long)dsfmt->status + lVar6 + 0x4a8);
    uVar5 = (uVar2 << 0x20 | uVar2 >> 0x20) ^ uVar1 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar6);
    uVar2 = (uVar4 << 0x20 | uVar4 >> 0x20) ^ uVar3 << 0x13 ^
            *(ulong *)((long)dsfmt->status + lVar6 + 8);
    *(ulong *)((long)dsfmt->status + lVar6 + 0x4a0) = uVar5 & 0xffafffffffb3f ^ uVar5 >> 0xc ^ uVar1
    ;
    *(ulong *)((long)dsfmt->status + lVar6 + 0x4a8) = uVar2 & 0xffdfffc90fffd ^ uVar2 >> 0xc ^ uVar3
    ;
    lVar6 = lVar6 + 0x10;
    uVar4 = uVar5;
  } while (lVar6 != 0x750);
  dsfmt->status[0xbf].u[0] = uVar5;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar2;
  return;
}

Assistant:

void dsfmt_gen_rand_all(dsfmt_t* dsfmt)
{
	int i;
	w128_t lung;

	lung = dsfmt->status[DSFMT_N];
	do_recursion(&dsfmt->status[0], &dsfmt->status[0],
	             &dsfmt->status[DSFMT_POS1], &lung);
	for (i = 1; i < DSFMT_N - DSFMT_POS1; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1], &lung);
	}
	for (; i < DSFMT_N; i++)
	{
		do_recursion(&dsfmt->status[i], &dsfmt->status[i],
		             &dsfmt->status[i + DSFMT_POS1 - DSFMT_N], &lung);
	}
	dsfmt->status[DSFMT_N] = lung;
}